

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

BOOL __thiscall Js::JavascriptProxy::HasOwnItem(JavascriptProxy *this,uint32 index)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  JavascriptFunction *pJVar3;
  bool bVar4;
  BOOL BVar5;
  Attributes attributes;
  BOOL BVar6;
  int iVar7;
  HostScriptContext *pHVar8;
  RecyclableObject *pRVar9;
  JavascriptMethod p_Var10;
  PropertyId propertyId;
  PropertyDescriptor local_98;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  Var local_58;
  Var local_50;
  JavascriptFunction *local_48;
  RecyclableObject *local_40;
  bool local_31;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  pHVar8 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar8->scriptContext;
  local_58 = CrossSite::MarshalVar(pSVar2,(this->handler).ptr,false);
  if (local_58 == (Var)0x0) {
    bVar4 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar4) {
      return 0;
    }
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea15,L"has");
  }
  pRVar9 = (RecyclableObject *)CrossSite::MarshalVar(pSVar2,(this->target).ptr,false);
  local_48 = GetMethodHelper(this,0xb4,pSVar2);
  if ((local_48 == (JavascriptFunction *)0x0) ||
     (bVar4 = Memory::Recycler::IsHeapEnumInProgress(pSVar2->recycler), bVar4)) {
    BVar5 = JavascriptOperators::HasOwnItem(pRVar9,index);
    return BVar5;
  }
  local_40 = pRVar9;
  PropertyIdFromInt(this,index,&local_68);
  propertyId = local_68->pid;
  local_50 = GetName(pSVar2,propertyId);
  pJVar3 = local_48;
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)local_48);
  bVar4 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)pJVar3,attributes);
  if (bVar4) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    pJVar3 = local_48;
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)local_48);
    CheckIsExecutable((RecyclableObject *)pJVar3,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar3);
    pRVar9 = (RecyclableObject *)
             (*p_Var10)((RecyclableObject *)pJVar3,(CallInfo)pJVar3,0x2000003,0,0,0,0,0x2000003,
                        local_58,local_40,local_50);
    bVar4 = ThreadContext::IsOnStack(pRVar9);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      pRVar9 = (((((((((local_48->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                 super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      goto LAB_00d09a94;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      propertyRecord._4_4_ = propertyId;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      pJVar3 = local_48;
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)local_48);
      CheckIsExecutable((RecyclableObject *)pJVar3,p_Var10);
      p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar3);
      pRVar9 = (RecyclableObject *)
               (*p_Var10)((RecyclableObject *)pJVar3,(CallInfo)pJVar3,0x2000003,0,0,0,0,0x2000003,
                          local_58,local_40,local_50);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      propertyId = propertyRecord._4_4_;
      goto LAB_00d09a94;
    }
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    pJVar3 = local_48;
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)local_48);
    CheckIsExecutable((RecyclableObject *)pJVar3,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar3);
    pRVar9 = (RecyclableObject *)
             (*p_Var10)((RecyclableObject *)pJVar3,(CallInfo)pJVar3,0x2000003,0,0,0,0,0x2000003,
                        local_58,local_40,local_50);
    bVar4 = ThreadContext::IsOnStack(pRVar9);
  }
  if (bVar4 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00d09a94:
  this_00->reentrancySafeOrHandled = local_31;
  BVar5 = JavascriptConversion::ToBoolean(pRVar9,pSVar2);
  if (BVar5 == 0) {
    PropertyDescriptor::PropertyDescriptor(&local_98);
    BVar6 = JavascriptOperators::GetOwnPropertyDescriptor(local_40,propertyId,pSVar2,&local_98);
    if (BVar6 != 0) {
      bVar4 = PropertyDescriptor::IsConfigurable(&local_98);
      if ((bVar4) &&
         (iVar7 = (*(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x33])(), iVar7 != 0)) {
        return 0;
      }
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"has");
    }
  }
  return BVar5;
}

Assistant:

BOOL JavascriptProxy::HasOwnItem(uint32 index)
    {
        const PropertyRecord* propertyRecord;
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::HasOwnItem(object, index);
        };
        auto getPropertyId = [&]() ->PropertyId {
            PropertyIdFromInt(index, &propertyRecord);
            return propertyRecord->GetPropertyId();
        };
        return HasPropertyTrap(fn, getPropertyId);
    }